

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Rsa.cpp
# Opt level: O1

bool __thiscall
axl::cry::Rsa::signHash
          (Rsa *this,int type,Array<char,_axl::sl::ArrayDetails<char>_> *signature,void *hash,
          size_t hashSize)

{
  bool bVar1;
  int iVar2;
  size_t count;
  char *signatureBuffer;
  
  iVar2 = RSA_size((RSA *)(this->super_Handle<rsa_st_*,_axl::cry::FreeRsa,_axl::sl::Zero<rsa_st_*>_>
                          ).m_h);
  bVar1 = sl::Array<char,_axl::sl::ArrayDetails<char>_>::
          setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(signature,(long)iVar2);
  if (bVar1) {
    bVar1 = sl::Array<char,_axl::sl::ArrayDetails<char>_>::ensureExclusive(signature);
    if (bVar1) {
      signatureBuffer = (signature->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p;
    }
    else {
      signatureBuffer = (char *)0x0;
    }
    count = signHash(this,type,signatureBuffer,(long)iVar2,hash,hashSize);
    bVar1 = count != 0xffffffffffffffff;
    if (bVar1) {
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::
      setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(signature,count);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
Rsa::signHash(
	int type,
	sl::Array<char>* signature,
	const void* hash,
	size_t hashSize
) {
	size_t signatureBufferSize = getSize();
	bool result = signature->setCount(signatureBufferSize);
	if (!result)
		return false;

	size_t size = signHash(type, signature->p(), signatureBufferSize, hash, hashSize);
	if (size == -1)
		return false;

	ASSERT(size <= signatureBufferSize);
	signature->setCount(size);
	return true;
}